

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O3

void lz_encoder_end(lzma_coder_conflict14 *coder,lzma_allocator *allocator)

{
  lzma_coder_conflict14 *ptr;
  _func_void_lzma_coder_ptr_lzma_allocator_ptr_conflict12 *p_Var1;
  
  lzma_next_end((lzma_next_coder *)&coder->next,allocator);
  lzma_free((coder->mf).hash,allocator);
  lzma_free((coder->mf).buffer,allocator);
  ptr = (coder->lz).coder;
  p_Var1 = (coder->lz).end;
  if (p_Var1 == (_func_void_lzma_coder_ptr_lzma_allocator_ptr_conflict12 *)0x0) {
    lzma_free(ptr,allocator);
  }
  else {
    (*p_Var1)(ptr,allocator);
  }
  lzma_free(coder,allocator);
  return;
}

Assistant:

static void
lz_encoder_end(lzma_coder *coder, lzma_allocator *allocator)
{
	lzma_next_end(&coder->next, allocator);

	lzma_free(coder->mf.hash, allocator);
	lzma_free(coder->mf.buffer, allocator);

	if (coder->lz.end != NULL)
		coder->lz.end(coder->lz.coder, allocator);
	else
		lzma_free(coder->lz.coder, allocator);

	lzma_free(coder, allocator);
	return;
}